

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.h
# Opt level: O2

void __thiscall EndPoint::EndPoint(EndPoint *this,int _id)

{
  this->id = _id;
  (this->caches).super__Vector_base<Cache_*,_std::allocator<Cache_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->caches).super__Vector_base<Cache_*,_std::allocator<Cache_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->caches).super__Vector_base<Cache_*,_std::allocator<Cache_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->caches_id).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->caches_id).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->caches_id).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->latency_to)._M_h._M_buckets = &(this->latency_to)._M_h._M_single_bucket;
  (this->latency_to)._M_h._M_bucket_count = 1;
  (this->latency_to)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->latency_to)._M_h._M_element_count = 0;
  (this->latency_to)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->latency_to)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->latency_to)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->latency_to_id)._M_h._M_buckets = &(this->latency_to_id)._M_h._M_single_bucket;
  (this->latency_to_id)._M_h._M_bucket_count = 1;
  (this->latency_to_id)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->latency_to_id)._M_h._M_element_count = 0;
  (this->latency_to_id)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->latency_to_id)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->latency_to_id)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->requests).super__Vector_base<Request_*,_std::allocator<Request_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->requests).super__Vector_base<Request_*,_std::allocator<Request_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->requests).super__Vector_base<Request_*,_std::allocator<Request_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->requests_id).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->requests_id).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->requests_id).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

EndPoint(int _id) : id(_id) {}